

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

size_t __thiscall wasm::MultiMemoryLowering::getInitialOffset(MultiMemoryLowering *this,Index idx)

{
  pointer pNVar1;
  Global *pGVar2;
  uint64_t uVar3;
  Name name;
  
  if (idx == 0) {
    return 0;
  }
  pNVar1 = (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  name.super_IString.str._M_str = pNVar1[idx - 1].super_IString.str._M_str;
  name.super_IString.str._M_len = pNVar1[idx - 1].super_IString.str._M_len;
  pGVar2 = Module::getGlobal(this->wasm,name);
  if (pGVar2->init->_id == ConstId) {
    uVar3 = Literal::getUnsigned((Literal *)(pGVar2->init + 1));
    return uVar3;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
}

Assistant:

size_t getInitialOffset(Index idx) {
    if (idx == 0) {
      return 0;
    }
    auto* g = wasm->getGlobal(getOffsetGlobal(idx));
    return g->init->cast<Const>()->value.getUnsigned();
  }